

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O2

void __thiscall baryonyx::problem::problem(problem *this,problem *param_1)

{
  problem_solver_type pVar1;
  
  std::__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  objective_function::objective_function(&this->objective,&param_1->objective);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->equal_constraints,&param_1->equal_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->greater_constraints,&param_1->greater_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->less_constraints,&param_1->less_constraints);
  baryonyx::variables::variables(&this->vars,&param_1->vars);
  affected_variables::affected_variables(&this->affected_vars,&param_1->affected_vars);
  pVar1 = param_1->problem_type;
  this->type = param_1->type;
  this->problem_type = pVar1;
  return;
}

Assistant:

problem() = default;